

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assign2product4setup<double,double>
          (SSVectorBase<double> *this,SVSetBase<double> *A,SSVectorBase<double> *x,Timer *timeSparse
          ,Timer *timeFull,int *nCallsSparse,int *nCallsFull)

{
  int iVar1;
  _func_int **pp_Var2;
  
  clear(this);
  iVar1 = (x->super_IdxSet).num;
  if (iVar1 == 1) {
    if (timeSparse == (Timer *)0x0) {
      assign2product1<double,double>(this,A,x);
LAB_001d3662:
      this->setupStatus = true;
      goto LAB_001d367c;
    }
    (*timeSparse->_vptr_Timer[3])(timeSparse);
    assign2product1<double,double>(this,A,x);
LAB_001d35d4:
    this->setupStatus = true;
    pp_Var2 = timeSparse->_vptr_Timer;
  }
  else {
    if (this->setupStatus == true) {
      if ((double)(A->super_ClassArray<soplex::Nonzero<double>_>).thesize * (double)iVar1 <=
          (double)(A->set).thenum *
          (double)(int)((ulong)((long)(this->super_VectorBase<double>).val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(this->super_VectorBase<double>).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3) * 0.5) {
        if (timeSparse == (Timer *)0x0) {
          assign2productShort<double,double>(this,A,x);
          goto LAB_001d3662;
        }
        (*timeSparse->_vptr_Timer[3])(timeSparse);
        assign2productShort<double,double>(this,A,x);
        goto LAB_001d35d4;
      }
    }
    nCallsSparse = nCallsFull;
    if (timeFull == (Timer *)0x0) {
      assign2productFull<double,double>(this,A,x);
      this->setupStatus = false;
      goto LAB_001d367c;
    }
    (*timeFull->_vptr_Timer[3])(timeFull);
    assign2productFull<double,double>(this,A,x);
    this->setupStatus = false;
    pp_Var2 = timeFull->_vptr_Timer;
    timeSparse = timeFull;
  }
  (*pp_Var2[4])(timeSparse);
LAB_001d367c:
  *nCallsSparse = *nCallsSparse + 1;
  return this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product4setup(const SVSetBase<S>& A,
      const SSVectorBase<T>& x,
      Timer* timeSparse, Timer* timeFull,
      int& nCallsSparse, int& nCallsFull
                                                      )
{
   assert(A.num() == x.dim());
   assert(x.isSetup());
   clear();

   if(x.size() == 1)
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2product1(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else if(isSetup()
           && (double(x.size()) * A.memSize() <= SOPLEX_SHORTPRODUCT_FACTOR * dim() * A.num()))
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2productShort(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else
   {
      if(timeFull != nullptr)
         timeFull->start();

      assign2productFull(A, x);
      setupStatus = false;

      if(timeFull != nullptr)
         timeFull->stop();

      ++nCallsFull;
   }

   assert(isConsistent());

   return *this;
}